

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str)

{
  StringEqualsMatcher local_70;
  
  Matchers::Equals(&local_70,str,Yes);
  handleExceptionMatchExpr(handler,(StringMatcher *)&local_70);
  local_70.super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_001ae820;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_StringMatcherBase.m_comparator.m_str._M_dataplus._M_p !=
      &local_70.super_StringMatcherBase.m_comparator.m_str.field_2) {
    operator_delete(local_70.super_StringMatcherBase.m_comparator.m_str._M_dataplus._M_p,
                    local_70.super_StringMatcherBase.m_comparator.m_str.field_2.
                    _M_allocated_capacity + 1);
  }
  local_70.super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherGenericBase_001ae768;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_StringMatcherBase.
         super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p !=
      &local_70.super_StringMatcherBase.
       super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_MatcherUntypedBase.m_cachedToString.field_2) {
    operator_delete(local_70.super_StringMatcherBase.
                    super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p,
                    local_70.super_StringMatcherBase.
                    super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_MatcherUntypedBase.m_cachedToString.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ) );
    }